

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

void __thiscall
cppqc::Generator<std::tuple<std::vector<int,std::allocator<int>>>>::
Generator<cppqc::detail::TupleGenerator<std::vector<int,std::allocator<int>>>>
          (Generator<std::tuple<std::vector<int,_std::allocator<int>_>_>_> *this,
          TupleGenerator<std::vector<int,_std::allocator<int>_>_> *gm)

{
  unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *this_00;
  GenModel<cppqc::detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>_> *in_RSI;
  pointer in_RDI;
  TupleGenerator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffe8;
  
  this_00 = (unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)operator_new(0x10);
  detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>::TupleGenerator
            ((TupleGenerator<std::vector<int,_std::allocator<int>_>_> *)this_00,
             (TupleGenerator<std::vector<int,_std::allocator<int>_>_> *)in_RDI);
  Generator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>::
  GenModel<cppqc::detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>_>::GenModel
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,std::allocator<int>>>>,std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,std::allocator<int>>>>>>
  ::
  unique_ptr<std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,std::allocator<int>>>>>,void>
            (this_00,in_RDI);
  detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>::~TupleGenerator
            ((TupleGenerator<std::vector<int,_std::allocator<int>_>_> *)0x4277fa);
  return;
}

Assistant:

Generator(const GeneratorModel& gm)
      : m_gen{new GenModel<GeneratorModel>(gm)} {}